

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O3

int __thiscall CVmFormatterDisp::init(CVmFormatterDisp *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  
  CVmFormatter::init(&this->super_CVmFormatter,ctx);
  uVar1 = (*(this->super_CVmFormatter)._vptr_CVmFormatter[0xf])(this);
  *(ushort *)&(this->super_CVmFormatter).field_0xef81 =
       *(ushort *)&(this->super_CVmFormatter).field_0xef81 & 0xffbf | (ushort)((uVar1 & 1) << 6);
  if ((uVar1 & 1) == 0) {
    return uVar1;
  }
  iVar2 = (*(this->super_CVmFormatter)._vptr_CVmFormatter[3])(this);
  return iVar2;
}

Assistant:

void init()
    {
        /* inherit base class initialization */
        CVmFormatter::init();

        /* 
         *   if we're compiled for HTML mode, set the standard output
         *   stream so that it knows it has an HTML target - this will
         *   ensure that HTML tags are passed through to the underlying
         *   stream, and that we generate HTML equivalents for our own
         *   control sequences 
         */ 
        html_target_ = get_init_html_target();

        /* 
         *   since we always use HTML mode, turn on HTML mode in the
         *   underlying OS window if our underlying OS renderer is HTML-aware
         */
        if (html_target_)
            start_html_in_os();
    }